

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O0

double asind(double v)

{
  double in_XMM0_Qa;
  double dVar1;
  
  if (-1.0 < in_XMM0_Qa) {
    if ((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) {
      return 0.0;
    }
    if ((1.0 <= in_XMM0_Qa) && (in_XMM0_Qa - 1.0 < 1e-10)) {
      return 90.0;
    }
  }
  else if (-1e-10 < in_XMM0_Qa + 1.0) {
    return -90.0;
  }
  dVar1 = asin(in_XMM0_Qa);
  return dVar1 * 57.29577951308232;
}

Assistant:

double asind(double v) {
    if (v <= -1.0) {
        if (v + 1.0 > -TRIG_TOL)
            return -90.0;
    } else if (v == 0.0) {
        return 0.0;
    } else if (v >= 1.0) {
        if (v - 1.0 < TRIG_TOL)
            return 90.0;
    }

    return asin(v) * R2D;
}